

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

Bitset * __thiscall
diligent_spirv_cross::Compiler::combined_decoration_for_member
          (Bitset *__return_storage_ptr__,Compiler *this,SPIRType *type,uint32_t index)

{
  Meta *pMVar1;
  SPIRType *type_00;
  SPIRType *pSVar2;
  ulong uVar3;
  uint index_00;
  Bitset local_70;
  
  __return_storage_ptr__->lower = 0;
  (__return_storage_ptr__->higher)._M_h._M_buckets =
       &(__return_storage_ptr__->higher)._M_h._M_single_bucket;
  (__return_storage_ptr__->higher)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->higher)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->higher)._M_h._M_element_count = 0;
  (__return_storage_ptr__->higher)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->higher)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->higher)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pMVar1 = ParsedIR::find_meta(&this->ir,(ID)(type->super_IVariant).self.id);
  if ((pMVar1 != (Meta *)0x0) &&
     (uVar3 = (ulong)index,
     uVar3 < (pMVar1->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.buffer_size)
     ) {
    Bitset::merge_or(__return_storage_ptr__,
                     &(pMVar1->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.ptr
                      [uVar3].decoration_flags);
    type_00 = get<diligent_spirv_cross::SPIRType>
                        (this,(type->member_types).
                              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                              .ptr[uVar3].id);
    for (index_00 = 0;
        (ulong)index_00 <
        (type_00->member_types).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.buffer_size
        ; index_00 = index_00 + 1) {
      pSVar2 = get<diligent_spirv_cross::SPIRType>
                         (this,(type_00->member_types).
                               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                               .ptr[index_00].id);
      if (pSVar2->pointer == false) {
        combined_decoration_for_member(&local_70,this,type_00,index_00);
        Bitset::merge_or(__return_storage_ptr__,&local_70);
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_70.higher._M_h);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Bitset Compiler::combined_decoration_for_member(const SPIRType &type, uint32_t index) const
{
	Bitset flags;
	auto *type_meta = ir.find_meta(type.self);

	if (type_meta)
	{
		auto &members = type_meta->members;
		if (index >= members.size())
			return flags;
		auto &dec = members[index];

		flags.merge_or(dec.decoration_flags);

		auto &member_type = get<SPIRType>(type.member_types[index]);

		// If our member type is a struct, traverse all the child members as well recursively.
		auto &member_childs = member_type.member_types;
		for (uint32_t i = 0; i < member_childs.size(); i++)
		{
			auto &child_member_type = get<SPIRType>(member_childs[i]);
			if (!child_member_type.pointer)
				flags.merge_or(combined_decoration_for_member(member_type, i));
		}
	}

	return flags;
}